

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCaseInfo *testCase)

{
  __type _Var1;
  bool bVar2;
  logic_error *this_00;
  string *s;
  
  if (this->m_wildcardPosition < 4) {
    s = &testCase->m_name;
    switch(this->m_wildcardPosition) {
    case NoWildcard:
      _Var1 = std::operator==(&this->m_stringToMatch,s);
      return _Var1;
    case WildcardAtStart:
      bVar2 = endsWith(s,&this->m_stringToMatch);
      return bVar2;
    case WildcardAtEnd:
      bVar2 = startsWith(s,&this->m_stringToMatch);
      return bVar2;
    case WildcardAtBothEnds:
      bVar2 = contains(s,&this->m_stringToMatch);
      return bVar2;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unhandled wildcard type");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool isMatch( const TestCaseInfo& testCase ) const {
            const std::string& name = testCase.getName();

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }